

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::checkbox::render_value(checkbox *this,form_context *context)

{
  bool bVar1;
  html_type hVar2;
  ostream *poVar3;
  form_context *in_RSI;
  checkbox *in_RDI;
  string *in_stack_ffffffffffffffc8;
  string local_30 [16];
  form_context *in_stack_ffffffffffffffe0;
  
  bVar1 = value(in_RDI);
  if (bVar1) {
    hVar2 = form_context::html(in_RSI);
    if (hVar2 == as_xhtml) {
      poVar3 = form_context::out(in_stack_ffffffffffffffe0);
      std::operator<<(poVar3," checked=\"checked\" ");
    }
    else {
      poVar3 = form_context::out(in_stack_ffffffffffffffe0);
      std::operator<<(poVar3," checked ");
    }
  }
  poVar3 = form_context::out(in_stack_ffffffffffffffe0);
  poVar3 = std::operator<<(poVar3,"value=\"");
  util::escape(in_stack_ffffffffffffffc8);
  poVar3 = std::operator<<(poVar3,local_30);
  std::operator<<(poVar3,"\" ");
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void checkbox::render_value(form_context &context)
{
	if(value()) {
		if(context.html() == as_xhtml)
			context.out() << " checked=\"checked\" ";
		else
			context.out() << " checked ";
	}
	context.out() << "value=\""<<util::escape(identification_)<<"\" ";
}